

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_validation.c
# Opt level: O2

REF_STATUS ref_validation_twod_orientation(REF_GRID ref_grid)

{
  REF_NODE ref_node;
  REF_CELL ref_cell;
  bool bVar1;
  REF_STATUS RVar2;
  uint uVar3;
  int cell;
  REF_BOOL correct_orientation;
  REF_INT nodes [27];
  
  if (ref_grid->twod != 0) {
    ref_node = ref_grid->node;
    ref_cell = ref_grid->cell[3];
    bVar1 = true;
    for (cell = 0; cell < ref_cell->max; cell = cell + 1) {
      RVar2 = ref_cell_nodes(ref_cell,cell,nodes);
      if (RVar2 == 0) {
        uVar3 = ref_node_tri_twod_orientation(ref_node,nodes,&correct_orientation);
        if (uVar3 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_validation.c"
                 ,0x1fe,"ref_validation_twod_orientation",(ulong)uVar3,"valid");
          return uVar3;
        }
        if (correct_orientation == 0) {
          bVar1 = false;
          printf("tri %d %d %d %d\n",(ulong)(uint)nodes[0],(ulong)(uint)nodes[1],
                 (ulong)(uint)nodes[2],(ulong)(uint)nodes[3]);
        }
      }
    }
    if (!bVar1) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_validation.c",
             0x205,"ref_validation_twod_orientation","incorrect twod tri orientation");
      return 1;
    }
  }
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_validation_twod_orientation(REF_GRID ref_grid) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell;
  REF_INT cell, nodes[REF_CELL_MAX_SIZE_PER];
  REF_BOOL correct_orientation, valid = REF_TRUE;

  if (!ref_grid_twod(ref_grid)) return REF_SUCCESS;

  ref_cell = ref_grid_tri(ref_grid);
  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    RSS(ref_node_tri_twod_orientation(ref_node, nodes, &correct_orientation),
        "valid");
    if (!correct_orientation) {
      valid = REF_FALSE;
      printf("tri %d %d %d %d\n", nodes[0], nodes[1], nodes[2], nodes[3]);
    }
  }

  RAS(valid, "incorrect twod tri orientation");

  return REF_SUCCESS;
}